

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSort.cpp
# Opt level: O1

void addToDecreasingHeap(HighsInt *n,HighsInt mx_n,vector<double,_std::allocator<double>_> *heap_v,
                        vector<int,_std::allocator<int>_> *heap_ix,double v,HighsInt ix)

{
  double dVar1;
  pointer piVar2;
  ulong uVar3;
  uint uVar4;
  pointer pdVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  
  iVar10 = *n;
  if (iVar10 < mx_n) {
    uVar6 = iVar10 + 1;
    *n = uVar6;
    if (0 < iVar10) {
      pdVar5 = (heap_v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar2 = (heap_ix->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar7 = (ulong)uVar6;
      do {
        uVar4 = (uint)uVar7;
        uVar3 = uVar7 >> 1;
        dVar1 = pdVar5[uVar3];
        uVar6 = uVar4;
        if (dVar1 <= v) break;
        pdVar5[uVar7] = dVar1;
        piVar2[uVar7] = piVar2[uVar3];
        uVar7 = uVar3;
        uVar6 = (uint)uVar3;
      } while (3 < uVar4);
    }
    lVar8 = (long)(int)uVar6;
    pdVar5 = (heap_v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start + lVar8;
  }
  else {
    pdVar5 = (heap_v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (v < pdVar5[1] || v == pdVar5[1]) goto LAB_0037f963;
    iVar10 = *n;
    lVar8 = 1;
    if (1 < iVar10) {
      piVar2 = (heap_ix->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = 2;
      uVar4 = 1;
      do {
        uVar9 = uVar6;
        if (((int)uVar6 < iVar10) &&
           (pdVar5[(int)(uVar6 | 1)] <= pdVar5[(int)uVar6] &&
            pdVar5[(int)uVar6] != pdVar5[(int)(uVar6 | 1)])) {
          uVar9 = uVar6 | 1;
        }
        if (v <= pdVar5[(int)uVar9]) break;
        pdVar5[(int)uVar4] = pdVar5[(int)uVar9];
        piVar2[(int)uVar4] = piVar2[(int)uVar9];
        uVar6 = uVar9 * 2;
        iVar10 = *n;
        uVar4 = uVar9;
      } while ((int)uVar6 <= iVar10);
      lVar8 = (long)(int)uVar4;
    }
    pdVar5 = pdVar5 + lVar8;
  }
  *pdVar5 = v;
  (heap_ix->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
  [lVar8] = ix;
LAB_0037f963:
  *(heap_ix->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
       = 1;
  return;
}

Assistant:

void addToDecreasingHeap(HighsInt& n, HighsInt mx_n, vector<double>& heap_v,
                         vector<HighsInt>& heap_ix, const double v,
                         const HighsInt ix) {
  HighsInt cd_p, pa_p;
  if (n < mx_n) {
    // The heap is not full so put the new value at the bottom of the
    // heap and let it rise up to its correct level.
    n++;
    cd_p = n;
    pa_p = cd_p / 2;
    for (;;) {
      if (pa_p > 0) {
        if (v < heap_v[pa_p]) {
          heap_v[cd_p] = heap_v[pa_p];
          heap_ix[cd_p] = heap_ix[pa_p];
          cd_p = pa_p;
          pa_p = pa_p / 2;
          continue;
        }
      }
      break;
    }
    heap_v[cd_p] = v;
    heap_ix[cd_p] = ix;
  } else if (v > heap_v[1]) {
    // The heap is full so replace the least value with the new value
    // and let it sink down to its correct level.
    pa_p = 1;
    cd_p = pa_p + pa_p;
    for (;;) {
      if (cd_p <= n) {
        if (cd_p < n) {
          if (heap_v[cd_p] > heap_v[cd_p + 1]) cd_p++;
        }
        if (v > heap_v[cd_p]) {
          heap_v[pa_p] = heap_v[cd_p];
          heap_ix[pa_p] = heap_ix[cd_p];
          pa_p = cd_p;
          cd_p = cd_p + cd_p;
          continue;
        }
      }
      break;
    }
    heap_v[pa_p] = v;
    heap_ix[pa_p] = ix;
  }
  // Set heap_ix[0]=1 to indicate that the values form a heap.
  heap_ix[0] = 1;
  return;
}